

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context__try_get_device_name_by_id
                    (ma_context *pContext,ma_device_type deviceType,ma_device_id *pDeviceID,
                    char *pName,size_t nameBufferSize)

{
  ma_context *pmVar1;
  ma_result mVar2;
  _func_ma_result_ma_context_ptr_ma_enum_devices_callback_proc_void_ptr *p_Var3;
  ma_context__try_get_device_name_by_id__enum_callback_data data;
  
  if (pName != (char *)0x0) {
    if (pDeviceID == (ma_device_id *)0x0) {
      mVar2 = -0x68;
    }
    else {
      data.nameBufferSize = 0x100;
      data.foundDevice = 0;
      p_Var3 = pContext->onEnumDevices;
      if (p_Var3 == (_func_ma_result_ma_context_ptr_ma_enum_devices_callback_proc_void_ptr *)0x0) {
        mVar2 = -2;
      }
      else {
        pmVar1 = (pContext->deviceEnumLock).pContext;
        data.deviceType = deviceType;
        data.pDeviceID = pDeviceID;
        data.pName = pName;
        if (pmVar1 != (ma_context *)0x0) {
          (*(pmVar1->field_22).posix.pthread_mutex_lock)(&(pContext->deviceEnumLock).field_1);
          p_Var3 = pContext->onEnumDevices;
        }
        mVar2 = (*p_Var3)(pContext,ma_context__try_get_device_name_by_id__enum_callback,&data);
        pmVar1 = (pContext->deviceEnumLock).pContext;
        if (pmVar1 != (ma_context *)0x0) {
          (*(pmVar1->field_22).posix.pthread_mutex_unlock)(&(pContext->deviceEnumLock).field_1);
        }
        if ((mVar2 == 0) && (mVar2 = -0x68, data.foundDevice != 0)) {
          mVar2 = 0;
        }
      }
    }
    return mVar2;
  }
  __assert_fail("pName != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x2420,
                "ma_result ma_context__try_get_device_name_by_id(ma_context *, ma_device_type, const ma_device_id *, char *, size_t)"
               );
}

Assistant:

static ma_result ma_context__try_get_device_name_by_id(ma_context* pContext, ma_device_type deviceType, const ma_device_id* pDeviceID, char* pName, size_t nameBufferSize)
{
    ma_result result;
    ma_context__try_get_device_name_by_id__enum_callback_data data;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pName != NULL);

    if (pDeviceID == NULL) {
        return MA_NO_DEVICE;
    }

    data.deviceType = deviceType;
    data.pDeviceID = pDeviceID;
    data.pName = pName;
    data.nameBufferSize = nameBufferSize;
    data.foundDevice = MA_FALSE;
    result = ma_context_enumerate_devices(pContext, ma_context__try_get_device_name_by_id__enum_callback, &data);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (!data.foundDevice) {
        return MA_NO_DEVICE;
    } else {
        return MA_SUCCESS;
    }
}